

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_utils.h
# Opt level: O0

int check_txfm_eval(MACROBLOCK *x,BLOCK_SIZE bsize,int64_t best_skip_rd,int64_t skip_rd,int level,
                   int is_luma_only)

{
  long in_RCX;
  long in_RDX;
  byte in_SIL;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  long local_a8;
  int local_a0;
  int local_9c;
  int local_88 [6];
  int64_t rd_thresh;
  int iStack_68;
  int mul_factor;
  int luma_mul [6];
  int pred_qindex_thresh;
  int aggr_factor;
  int level_to_qindex_map [6];
  int qslope;
  int scale [6];
  int eval_txfm;
  
  level_to_qindex_map[5] = 1;
  _pred_qindex_thresh = 0x47fffffff;
  level_to_qindex_map[0] = 3;
  level_to_qindex_map[1] = 2;
  level_to_qindex_map[2] = 2;
  level_to_qindex_map[3] = 1;
  luma_mul[5] = (uint)((in_R9D != 0 ^ 0xffU) & 1) * 2;
  _iStack_68 = 0;
  luma_mul[0] = 0;
  luma_mul[1] = 0x50;
  luma_mul[2] = 100;
  luma_mul[3] = 0x8c;
  rd_thresh._4_4_ = 4;
  rd_thresh._0_4_ = (&iStack_68)[in_R8D];
  if ((in_R9D == 0) && (in_R8D < 3)) {
    if ((0xff - *(int *)(in_RDI + 0x4208)) * luma_mul[5] + 0x80 >> 8 < 1) {
      local_9c = 1;
    }
    else {
      local_9c = (0xff - *(int *)(in_RDI + 0x4208)) * luma_mul[5] + 0x80 >> 8;
    }
    rd_thresh._4_4_ = local_9c << 2;
  }
  if (((long)(ulong)(uint)(*(int *)(in_RDI + 0x25640) <<
                          ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[in_SIL] + 7
                          & 0x1f)) < in_RDX) && ((&iStack_68)[in_R8D] <= *(int *)(in_RDI + 0x4208)))
  {
    rd_thresh._4_4_ = (&pred_qindex_thresh)[in_R8D] * rd_thresh._4_4_;
  }
  else if ((in_R8D < 2) && (in_R9D == 0)) {
    rd_thresh._4_4_ = (rd_thresh._4_4_ >> 2) * 6;
  }
  local_88[0] = 0x7fffffff;
  local_88[1] = 0x20;
  local_88[2] = 0x1d;
  local_88[3] = 0x11;
  local_88[4] = 0x11;
  local_88[5] = 0x11;
  if (in_R9D == 0) {
    local_a0 = 0x10;
  }
  else {
    local_a0 = local_88[in_R8D];
  }
  if (in_RDX == 0x7fffffffffffffff) {
    local_a8 = 0x7fffffffffffffff;
  }
  else {
    local_a8 = in_RDX * rd_thresh._4_4_ * (long)local_a0 >> 6;
  }
  level_to_qindex_map[5] = (int)(in_RCX <= local_a8);
  return level_to_qindex_map[5];
}

Assistant:

static inline int check_txfm_eval(MACROBLOCK *const x, BLOCK_SIZE bsize,
                                  int64_t best_skip_rd, int64_t skip_rd,
                                  int level, int is_luma_only) {
  int eval_txfm = 1;
  // Derive aggressiveness factor for gating the transform search
  // Lower value indicates more aggressiveness. Be more conservative (high
  // value) for (i) low quantizers (ii) regions where prediction is poor
  const int scale[MAX_TX_RD_GATE_LEVEL + 1] = { INT_MAX, 4, 3, 2, 2, 1 };
  const int qslope = 2 * (!is_luma_only);
  const int level_to_qindex_map[MAX_TX_RD_GATE_LEVEL + 1] = { 0,  0,   0,
                                                              80, 100, 140 };
  int aggr_factor = 4;
  assert(level <= MAX_TX_RD_GATE_LEVEL);
  const int pred_qindex_thresh = level_to_qindex_map[level];
  if (!is_luma_only && level <= 2) {
    aggr_factor = 4 * AOMMAX(1, ROUND_POWER_OF_TWO((MAXQ - x->qindex) * qslope,
                                                   QINDEX_BITS));
  }
  if ((best_skip_rd >
       (x->source_variance << (num_pels_log2_lookup[bsize] + RDDIV_BITS))) &&
      (x->qindex >= pred_qindex_thresh))
    aggr_factor *= scale[level];
  // For level setting 1, be more conservative for non-luma-only case even when
  // prediction is good.
  else if ((level <= 1) && !is_luma_only)
    aggr_factor = (aggr_factor >> 2) * 6;

  // Be more conservative for luma only cases (called from compound type rd)
  // since best_skip_rd is computed after and skip_rd is computed (with 8-bit
  // prediction signals blended for WEDGE/DIFFWTD rather than 16-bit) before
  // interpolation filter search
  const int luma_mul[MAX_TX_RD_GATE_LEVEL + 1] = {
    INT_MAX, 32, 29, 17, 17, 17
  };
  int mul_factor = is_luma_only ? luma_mul[level] : 16;
  int64_t rd_thresh =
      (best_skip_rd == INT64_MAX)
          ? best_skip_rd
          : (int64_t)(best_skip_rd * aggr_factor * mul_factor >> 6);
  if (skip_rd > rd_thresh) eval_txfm = 0;
  return eval_txfm;
}